

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

void __thiscall Am_Drawonable_Impl::Map_And_Wait(Am_Drawonable_Impl *this,bool wait)

{
  bool wait_local;
  Am_Drawonable_Impl *this_local;
  
  this->expect_map_change = true;
  XMapWindow(this->screen->display,this->xlib_drawable);
  (*(this->super_Am_Drawonable)._vptr_Am_Drawonable[0x14])();
  if (wait) {
    wait_for_mapnotify(this->screen->display,&this->xlib_drawable);
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Map_And_Wait(bool wait)
{
  expect_map_change = true;
  XMapWindow(screen->display, xlib_drawable);
  Flush_Output();
  if (wait)
    wait_for_mapnotify(screen->display, &xlib_drawable);
}